

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::MergeReturnPass::AddNewPhiNodes(MergeReturnPass *this,BasicBlock *bb)

{
  bool bVar1;
  IRContext *pIVar2;
  DominatorAnalysis *this_00;
  BasicBlock *pBVar3;
  mapped_type *ppIVar4;
  Instruction *inst_00;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *current_bb;
  BasicBlock *dominator;
  DominatorAnalysis *dom_tree;
  BasicBlock *bb_local;
  MergeReturnPass *this_local;
  
  dom_tree = (DominatorAnalysis *)bb;
  bb_local = (BasicBlock *)this;
  pIVar2 = Pass::context((Pass *)this);
  this_00 = IRContext::GetDominatorAnalysis(pIVar2,this->function_);
  pBVar3 = DominatorAnalysisBase::ImmediateDominator
                     (&this_00->super_DominatorAnalysisBase,(BasicBlock *)dom_tree);
  if (pBVar3 != (BasicBlock *)0x0) {
    pIVar2 = Pass::context((Pass *)this);
    ppIVar4 = std::
              unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>_>
              ::operator[](&this->original_dominator_,(key_type *)&dom_tree);
    for (__range3 = IRContext::get_instr_block(pIVar2,*ppIVar4);
        __range3 != (BasicBlock *)0x0 && __range3 != pBVar3;
        __range3 = DominatorAnalysisBase::ImmediateDominator
                             (&this_00->super_DominatorAnalysisBase,__range3)) {
      BasicBlock::begin((BasicBlock *)&__end3);
      BasicBlock::end((BasicBlock *)&inst);
      while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                       (iterator_template<spvtools::opt::Instruction> *)&inst),
            bVar1) {
        inst_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
        CreatePhiNodesForInst(this,(BasicBlock *)dom_tree,inst_00);
        InstructionList::iterator::operator++(&__end3);
      }
    }
  }
  return;
}

Assistant:

void MergeReturnPass::AddNewPhiNodes(BasicBlock* bb) {
  // New phi nodes are needed for any id whose definition used to dominate |bb|,
  // but no longer dominates |bb|.  These are found by walking the dominator
  // tree starting at the original immediate dominator of |bb| and ending at its
  // current dominator.

  // Because we are walking the updated dominator tree it is important that the
  // new phi nodes for the original dominators of |bb| have already been added.
  // Otherwise some ids might be missed.  Consider the case where bb1 dominates
  // bb2, and bb2 dominates bb3.  Suppose there are changes such that bb1 no
  // longer dominates bb2 and the same for bb2 and bb3.  This algorithm will not
  // look at the ids defined in bb1.  However, calling |AddNewPhiNodes(bb2)|
  // first will add a phi node in bb2 for that value.  Then a call to
  // |AddNewPhiNodes(bb3)| will process that value by processing the phi in bb2.
  DominatorAnalysis* dom_tree = context()->GetDominatorAnalysis(function_);

  BasicBlock* dominator = dom_tree->ImmediateDominator(bb);
  if (dominator == nullptr) {
    return;
  }

  BasicBlock* current_bb = context()->get_instr_block(original_dominator_[bb]);
  while (current_bb != nullptr && current_bb != dominator) {
    for (Instruction& inst : *current_bb) {
      CreatePhiNodesForInst(bb, inst);
    }
    current_bb = dom_tree->ImmediateDominator(current_bb);
  }
}